

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O0

void __thiscall duckdb::ConstantFilter::Serialize(ConstantFilter *this,Serializer *serializer)

{
  TableFilter *in_RSI;
  Serializer *in_RDI;
  Serializer *unaff_retaddr;
  Serializer *pSVar1;
  field_id_t field_id;
  
  pSVar1 = in_RDI;
  TableFilter::Serialize(in_RSI,in_RDI);
  field_id = (field_id_t)((ulong)pSVar1 >> 0x30);
  Serializer::WriteProperty<duckdb::ExpressionType>
            (unaff_retaddr,field_id,(char *)in_RSI,(ExpressionType *)in_RDI);
  Serializer::WriteProperty<duckdb::Value>(unaff_retaddr,field_id,(char *)in_RSI,(Value *)in_RDI);
  return;
}

Assistant:

void ConstantFilter::Serialize(Serializer &serializer) const {
	TableFilter::Serialize(serializer);
	serializer.WriteProperty<ExpressionType>(200, "comparison_type", comparison_type);
	serializer.WriteProperty<Value>(201, "constant", constant);
}